

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::OpenBuildFileStream(cmGlobalNinjaGenerator *this)

{
  char *pcVar1;
  cmGeneratedFileStream *pcVar2;
  string buildFilePath;
  allocator local_31;
  long *local_30 [2];
  long local_20 [2];
  
  pcVar1 = cmake::GetHomeOutputDirectory((this->super_cmGlobalGenerator).CMakeInstance);
  std::__cxx11::string::string((string *)local_30,pcVar1,&local_31);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::string::append((char *)local_30);
  if (this->BuildFileStream == (cmGeneratedFileStream *)0x0) {
    pcVar2 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar2,(char *)local_30[0],false);
    this->BuildFileStream = pcVar2;
  }
  WriteDisclaimer(this,(ostream *)this->BuildFileStream);
  pcVar2 = this->BuildFileStream;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# This file contains all the build statements describing the\n",0x3d
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# compilation DAG.\n\n",0x14);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenBuildFileStream()
{
  // Compute Ninja's build file path.
  std::string buildFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  buildFilePath += "/";
  buildFilePath += cmGlobalNinjaGenerator::NINJA_BUILD_FILE;

  // Get a stream where to generate things.
  if (!this->BuildFileStream)
    {
    this->BuildFileStream = new cmGeneratedFileStream(buildFilePath.c_str());
    if (!this->BuildFileStream)
      {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
      }
    }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->BuildFileStream);

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n"
    ;
}